

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddApa.c
# Opt level: O1

DdApaNumber
cuddApaCountMintermAux(DdNode *node,int digits,DdApaNumber max,DdApaNumber min,st__table *table)

{
  DdHalfWord DVar1;
  DdNode *pDVar2;
  ulong uVar3;
  int iVar4;
  DdApaNumber __ptr;
  DdApaNumber __ptr_00;
  long lVar5;
  ulong uVar6;
  DdApaNumber mint;
  uint *local_50;
  DdNode *local_48;
  DdNode *local_40;
  st__table *local_38;
  
  if (node->index == 0x7fffffff) {
    if (zero == node) {
      max = min;
    }
    if (background == node) {
      return min;
    }
    return max;
  }
  uVar3 = (ulong)(uint)digits;
  if ((1 < node->ref) && (iVar4 = st__lookup(table,(char *)node,(char **)&local_50), iVar4 != 0)) {
    return local_50;
  }
  local_48 = (node->type).kids.T;
  pDVar2 = (node->type).kids.E;
  __ptr = cuddApaCountMintermAux(local_48,digits,max,min,table);
  if (__ptr != (DdApaNumber)0x0) {
    local_40 = (DdNode *)((ulong)pDVar2 & 0xfffffffffffffffe);
    local_38 = table;
    __ptr_00 = cuddApaCountMintermAux(local_40,digits,max,min,table);
    if (__ptr_00 == (DdApaNumber)0x0) {
      DVar1 = local_48->ref;
      __ptr_00 = __ptr;
    }
    else {
      local_50 = (uint *)malloc((long)digits << 2);
      if (local_50 != (uint *)0x0) {
        if (((ulong)pDVar2 & 1) == 0) {
          if (0 < digits) {
            lVar5 = uVar3 + 1;
            do {
              local_50[lVar5 + -2] = __ptr_00[lVar5 + -2] + __ptr[lVar5 + -2];
              lVar5 = lVar5 + -1;
            } while (1 < lVar5);
          }
        }
        else if (0 < digits) {
          lVar5 = uVar3 + 1;
          uVar6 = 0x100000000;
          do {
            uVar6 = ((ulong)max[lVar5 + -2] + (uVar6 >> 0x20) + 0xffffffff) -
                    (ulong)__ptr_00[lVar5 + -2];
            local_50[lVar5 + -2] = (uint)uVar6;
            lVar5 = lVar5 + -1;
          } while (1 < lVar5);
          if (0 < digits) {
            lVar5 = uVar3 + 1;
            do {
              local_50[lVar5 + -2] = local_50[lVar5 + -2] + __ptr[lVar5 + -2];
              lVar5 = lVar5 + -1;
            } while (1 < lVar5);
          }
        }
        if (1 < digits) {
          lVar5 = uVar3 + 1;
          do {
            local_50[lVar5 + -2] = local_50[lVar5 + -2] >> 1 | local_50[lVar5 + -3] << 0x1f;
            lVar5 = lVar5 + -1;
          } while (2 < lVar5);
        }
        *local_50 = *local_50 >> 1;
        if (local_48->ref == 1) {
          free(__ptr);
        }
        if (local_40->ref == 1) {
          free(__ptr_00);
        }
        if (node->ref < 2) {
          return local_50;
        }
        iVar4 = st__insert(local_38,(char *)node,(char *)local_50);
        if (iVar4 != -10000) {
          return local_50;
        }
        if (local_50 == (uint *)0x0) {
          return (DdApaNumber)0x0;
        }
        free(local_50);
        return (DdApaNumber)0x0;
      }
      if (local_48->ref == 1) {
        free(__ptr);
      }
      DVar1 = local_40->ref;
    }
    if (DVar1 == 1) {
      free(__ptr_00);
    }
  }
  return (DdApaNumber)0x0;
}

Assistant:

static DdApaNumber
cuddApaCountMintermAux(
  DdNode * node,
  int  digits,
  DdApaNumber  max,
  DdApaNumber  min,
  st__table * table)
{
    DdNode      *Nt, *Ne;
    DdApaNumber mint, mint1, mint2;
    DdApaDigit  carryout;

    if (cuddIsConstant(node)) {
        if (node == background || node == zero) {
            return(min);
        } else {
            return(max);
        }
    }
    if (node->ref > 1 && st__lookup(table, (const char *)node, (char **)&mint)) {
        return(mint);
    }

    Nt = cuddT(node); Ne = cuddE(node);

    mint1 = cuddApaCountMintermAux(Nt,  digits, max, min, table);
    if (mint1 == NULL) return(NULL);
    mint2 = cuddApaCountMintermAux(Cudd_Regular(Ne), digits, max, min, table);
    if (mint2 == NULL) {
        if (Nt->ref == 1) ABC_FREE(mint1);
        return(NULL);
    }
    mint = Cudd_NewApaNumber(digits);
    if (mint == NULL) {
        if (Nt->ref == 1) ABC_FREE(mint1);
        if (Cudd_Regular(Ne)->ref == 1) ABC_FREE(mint2);
        return(NULL);
    }
    if (Cudd_IsComplement(Ne)) {
        (void) Cudd_ApaSubtract(digits,max,mint2,mint);
        carryout = Cudd_ApaAdd(digits,mint1,mint,mint);
    } else {
        carryout = Cudd_ApaAdd(digits,mint1,mint2,mint);
    }
    Cudd_ApaShiftRight(digits,carryout,mint,mint);
    /* If the refernce count of a child is 1, its minterm count
    ** hasn't been stored in table.  Therefore, it must be explicitly
    ** freed here. */
    if (Nt->ref == 1) ABC_FREE(mint1);
    if (Cudd_Regular(Ne)->ref == 1) ABC_FREE(mint2);

    if (node->ref > 1) {
        if ( st__insert(table, (char *)node, (char *)mint) == st__OUT_OF_MEM) {
            ABC_FREE(mint);
            return(NULL);
        }
    }
    return(mint);

}